

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O0

void __thiscall Rml::ElementEffects::InstanceEffects(ElementEffects *this)

{
  PropertyId PVar1;
  code *pcVar2;
  initializer_list<Rml::PropertyId> *this_00;
  ComputedValues *render_manager_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ElementDocument *this_01;
  String *pSVar5;
  element_type *peVar6;
  DecoratorPtrList *this_02;
  size_type sVar7;
  SharedPtr<const_Decorator> *pSVar8;
  const_reference pvVar9;
  const_iterator pPVar10;
  element_type *peVar11;
  size_type sVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  undefined8 uVar13;
  undefined8 uVar14;
  element_type *peVar15;
  uint local_2fc;
  char *local_2f0;
  FilterEntryList *local_2c0;
  DecoratorEntryList *local_290;
  SharedPtr<const_PropertySource> *source_1;
  CompiledFilter local_220;
  shared_ptr<Rml::Filter> local_210;
  undefined1 local_200 [8];
  SharedPtr<const_Filter> filter;
  FilterDeclaration *declaration;
  const_iterator __end3;
  const_iterator __begin3;
  Vector<FilterDeclaration> *__range3;
  FilterEntryList *list;
  FiltersPtr filters_ptr;
  Property *property_1;
  PropertyId id_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  undefined1 local_190 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  initializer_list<Rml::PropertyId> *__range2_1;
  DecoratorEntry entry;
  SharedPtr<const_Decorator> *decorator;
  size_t i;
  DecoratorEntryList *decorators_target;
  DecoratorPtrList *decorator_list;
  ElementDocument *document;
  PropertySource *source;
  String local_120;
  allocator<char> local_e9;
  String local_e8;
  undefined1 local_c8 [8];
  PropertySource document_source;
  undefined1 local_78 [8];
  DecoratorsPtr decorators_ptr;
  Property *property;
  PropertyId id;
  const_iterator __end2;
  const_iterator __begin2;
  undefined1 local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  initializer_list<Rml::PropertyId> *__range2;
  StyleSheet *style_sheet;
  ComputedValues *computed;
  RenderManager *render_manager;
  ElementEffects *this_local;
  
  if ((this->effects_dirty & 1U) != 0) {
    this->effects_dirty = false;
    this->effects_data_dirty = true;
    render_manager = (RenderManager *)this;
    ReleaseEffects(this);
    computed = (ComputedValues *)Element::GetRenderManager(this->element);
    if (computed == (ComputedValues *)0x0) {
      bVar3 = Assert("Decorators are being instanced before a render manager is available. Is this element attached to the document?"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                     ,0x3e);
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    else {
      style_sheet = (StyleSheet *)Element::GetComputedValues(this->element);
      bVar3 = Style::ComputedValues::has_decorator((ComputedValues *)style_sheet);
      if ((bVar3) ||
         (bVar3 = Style::ComputedValues::has_mask_image((ComputedValues *)style_sheet), bVar3)) {
        iVar4 = (*(this->element->super_ScriptInterface).super_Releasable._vptr_Releasable[4])();
        __range2 = (initializer_list<Rml::PropertyId> *)CONCAT44(extraout_var,iVar4);
        if (__range2 == (initializer_list<Rml::PropertyId> *)0x0) {
          return;
        }
        __begin2._6_1_ = 0x4c;
        __begin2._7_1_ = 0x4d;
        local_40._0_8_ = (long)&__begin2 + 6;
        local_40._8_8_ = (ElementDocument *)0x2;
        local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
        __end2 = ::std::initializer_list<Rml::PropertyId>::begin
                           ((initializer_list<Rml::PropertyId> *)local_30._M_pi);
        pPVar10 = ::std::initializer_list<Rml::PropertyId>::end
                            ((initializer_list<Rml::PropertyId> *)local_30._M_pi);
        for (; __end2 != pPVar10; __end2 = __end2 + 1) {
          PVar1 = *__end2;
          decorators_ptr.
          super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               Element::GetLocalProperty(this->element,PVar1);
          if (((Property *)
               decorators_ptr.
               super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (Property *)0x0) &&
             (((Property *)
              decorators_ptr.
              super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->unit == DECORATOR)) {
            Property::Get<std::shared_ptr<Rml::DecoratorDeclarationList_const>>
                      ((Property *)local_78);
            bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
            if (bVar3) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9)
              ;
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_120,"",(allocator<char> *)((long)&source + 7));
              PropertySource::PropertySource((PropertySource *)local_c8,&local_e8,0,&local_120);
              ::std::__cxx11::string::~string((string *)&local_120);
              ::std::allocator<char>::~allocator((allocator<char> *)((long)&source + 7));
              ::std::__cxx11::string::~string((string *)&local_e8);
              ::std::allocator<char>::~allocator(&local_e9);
              document = (ElementDocument *)
                         ::std::__shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                         ::get((__shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                *)(decorators_ptr.
                                   super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + 4));
              if ((document == (ElementDocument *)0x0) &&
                 (this_01 = Element::GetOwnerDocument(this->element),
                 this_01 != (ElementDocument *)0x0)) {
                pSVar5 = ElementDocument::GetSourceURL_abi_cxx11_(this_01);
                ::std::__cxx11::string::operator=((string *)local_c8,(string *)pSVar5);
                document = (ElementDocument *)local_c8;
              }
              render_manager_00 = computed;
              this_00 = __range2;
              peVar6 = ::std::
                       __shared_ptr_access<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_78);
              this_02 = StyleSheet::InstanceDecorators
                                  ((StyleSheet *)this_00,(RenderManager *)render_manager_00,peVar6,
                                   (PropertySource *)document);
              bVar3 = ::std::
                      vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                      ::empty(this_02);
              if (!bVar3) {
                sVar12 = ::std::
                         vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                         ::size(this_02);
                peVar6 = ::std::
                         __shared_ptr_access<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_78);
                sVar7 = ::std::
                        vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                        ::size(&peVar6->list);
                if ((sVar12 != sVar7) &&
                   (bVar3 = Assert("RMLUI_ASSERT(decorator_list.empty() || decorator_list.size() == decorators_ptr->list.size())"
                                   ,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                                   ,0x61), !bVar3)) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
              }
              if (PVar1 == Decorator) {
                local_290 = &this->decorators;
              }
              else {
                local_290 = &this->mask_images;
              }
              peVar6 = ::std::
                       __shared_ptr_access<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_78);
              sVar12 = ::std::
                       vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                       ::size(&peVar6->list);
              ::std::
              vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
              ::reserve(local_290,sVar12);
              decorator = (SharedPtr<const_Decorator> *)0x0;
              while( true ) {
                pSVar8 = (SharedPtr<const_Decorator> *)
                         ::std::
                         vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                         ::size(this_02);
                bVar3 = false;
                if (decorator < pSVar8) {
                  peVar6 = ::std::
                           __shared_ptr_access<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_78);
                  pSVar8 = (SharedPtr<const_Decorator> *)
                           ::std::
                           vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                           ::size(&peVar6->list);
                  bVar3 = decorator < pSVar8;
                }
                if (!bVar3) break;
                entry._24_8_ = ::std::
                               vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                               ::operator[](this_02,(size_type)decorator);
                bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)entry._24_8_);
                if (bVar3) {
                  DecoratorEntry::DecoratorEntry((DecoratorEntry *)&__range2_1);
                  entry.decorator.
                  super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  ::std::shared_ptr<const_Rml::Decorator>::operator=
                            ((shared_ptr<const_Rml::Decorator> *)&__range2_1,
                             (shared_ptr<const_Rml::Decorator> *)entry._24_8_);
                  peVar6 = ::std::
                           __shared_ptr_access<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_78);
                  pvVar9 = ::std::
                           vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                           ::operator[](&peVar6->list,(size_type)decorator);
                  entry.decorator_data._0_4_ = pvVar9->paint_area;
                  if (((BoxArea)entry.decorator_data == Auto) &&
                     (entry.decorator_data._0_4_ = Border, PVar1 == Decorator)) {
                    entry.decorator_data._0_4_ = Padding;
                  }
                  if ((((int)(BoxArea)entry.decorator_data < 1) ||
                      (3 < (int)(BoxArea)entry.decorator_data)) &&
                     (bVar3 = Assert("RMLUI_ASSERT(entry.paint_area >= BoxArea::Border && entry.paint_area <= BoxArea::Content)"
                                     ,
                                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                                     ,0x72), !bVar3)) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  ::std::
                  vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                  ::push_back(local_290,(value_type *)&__range2_1);
                  DecoratorEntry::~DecoratorEntry((DecoratorEntry *)&__range2_1);
                }
                decorator = (SharedPtr<const_Decorator> *)
                            ((long)&(decorator->
                                    super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + 1);
              }
              PropertySource::~PropertySource((PropertySource *)local_c8);
              document_source.rule_name.field_2._12_4_ = 0;
            }
            else {
              document_source.rule_name.field_2._12_4_ = 3;
            }
            ::std::shared_ptr<const_Rml::DecoratorDeclarationList>::~shared_ptr
                      ((shared_ptr<const_Rml::DecoratorDeclarationList> *)local_78);
          }
        }
      }
      bVar3 = Style::ComputedValues::has_filter((ComputedValues *)style_sheet);
      if ((bVar3) ||
         (bVar3 = Style::ComputedValues::has_backdrop_filter((ComputedValues *)style_sheet), bVar3))
      {
        __begin2_1._6_1_ = 0x4f;
        __begin2_1._7_1_ = 0x50;
        local_190._0_8_ = (long)&__begin2_1 + 6;
        local_190._8_8_ = (element_type *)0x2;
        local_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190;
        __end2_1 = ::std::initializer_list<Rml::PropertyId>::begin
                             ((initializer_list<Rml::PropertyId> *)local_180._M_pi);
        pPVar10 = ::std::initializer_list<Rml::PropertyId>::end
                            ((initializer_list<Rml::PropertyId> *)local_180._M_pi);
        for (; __end2_1 != pPVar10; __end2_1 = __end2_1 + 1) {
          PVar1 = *__end2_1;
          filters_ptr.
          super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               Element::GetLocalProperty(this->element,PVar1);
          if (((Property *)
               filters_ptr.
               super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (Property *)0x0) &&
             (((Property *)
              filters_ptr.
              super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->unit == FILTER)) {
            Property::Get<std::shared_ptr<Rml::FilterDeclarationList_const>>((Property *)&list);
            bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&list);
            if (bVar3) {
              if (PVar1 == Filter) {
                local_2c0 = &this->filters;
              }
              else {
                local_2c0 = &this->backdrop_filters;
              }
              peVar11 = ::std::
                        __shared_ptr_access<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&list);
              sVar12 = ::std::
                       vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>::size
                                 (&peVar11->list);
              ::std::
              vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
              ::reserve(local_2c0,sVar12);
              peVar11 = ::std::
                        __shared_ptr_access<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&list);
              __end3 = ::std::
                       vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>::
                       begin(&peVar11->list);
              declaration = (FilterDeclaration *)
                            ::std::
                            vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>
                            ::end(&peVar11->list);
              while (bVar3 = __gnu_cxx::operator!=
                                       (&__end3,(__normal_iterator<const_Rml::FilterDeclaration_*,_std::vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>_>
                                                 *)&declaration), bVar3) {
                filter.super___shared_ptr<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         __gnu_cxx::
                         __normal_iterator<const_Rml::FilterDeclaration_*,_std::vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>_>
                         ::operator*(&__end3);
                (*((reference)
                  filter.super___shared_ptr<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->instancer->_vptr_FilterInstancer[2])
                          (&local_210,
                           ((reference)
                           filter.super___shared_ptr<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->instancer,
                           filter.super___shared_ptr<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi,
                           &((reference)
                            filter.super___shared_ptr<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->properties);
                ::std::shared_ptr<Rml::Filter_const>::shared_ptr<Rml::Filter,void>
                          ((shared_ptr<Rml::Filter_const> *)local_200,&local_210);
                ::std::shared_ptr<Rml::Filter>::~shared_ptr(&local_210);
                bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_200);
                if (bVar3) {
                  ::std::shared_ptr<const_Rml::Filter>::shared_ptr
                            ((shared_ptr<const_Rml::Filter> *)&source_1,
                             (shared_ptr<const_Rml::Filter> *)local_200);
                  local_220.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.
                  render_manager = (RenderManager *)0x0;
                  local_220.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.
                  resource_handle = 0;
                  CompiledFilter::CompiledFilter(&local_220);
                  ::std::
                  vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                  ::push_back(local_2c0,(value_type *)&source_1);
                  FilterEntry::~FilterEntry((FilterEntry *)&source_1);
                }
                else {
                  this_03 = filters_ptr.
                            super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 4;
                  uVar13 = ::std::__cxx11::string::c_str();
                  ::std::
                  __shared_ptr_access<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&list);
                  uVar14 = ::std::__cxx11::string::c_str();
                  bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this_03);
                  if (bVar3) {
                    ::std::
                    __shared_ptr_access<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this_03);
                    local_2f0 = (char *)::std::__cxx11::string::c_str();
                  }
                  else {
                    local_2f0 = "";
                  }
                  bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this_03);
                  if (bVar3) {
                    peVar15 = ::std::
                              __shared_ptr_access<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)this_03);
                    local_2fc = peVar15->line_number;
                  }
                  else {
                    local_2fc = 0xffffffff;
                  }
                  Log::Message(LT_WARNING,
                               "Filter \'%s\' in \'%s\' could not be instanced, declared at %s:%d",
                               uVar13,uVar14,local_2f0,(ulong)local_2fc);
                }
                ::std::shared_ptr<const_Rml::Filter>::~shared_ptr
                          ((shared_ptr<const_Rml::Filter> *)local_200);
                __gnu_cxx::
                __normal_iterator<const_Rml::FilterDeclaration_*,_std::vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>_>
                ::operator++(&__end3);
              }
              document_source.rule_name.field_2._12_4_ = 0;
            }
            else {
              document_source.rule_name.field_2._12_4_ = 8;
            }
            ::std::shared_ptr<const_Rml::FilterDeclarationList>::~shared_ptr
                      ((shared_ptr<const_Rml::FilterDeclarationList> *)&list);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ElementEffects::InstanceEffects()
{
	if (!effects_dirty)
		return;

	effects_dirty = false;
	effects_data_dirty = true;

	RMLUI_ZoneScopedC(0xB22222);
	ReleaseEffects();

	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
	{
		RMLUI_ERRORMSG("Decorators are being instanced before a render manager is available. Is this element attached to the document?");
		return;
	}

	const ComputedValues& computed = element->GetComputedValues();

	if (computed.has_decorator() || computed.has_mask_image())
	{
		const StyleSheet* style_sheet = element->GetStyleSheet();
		if (!style_sheet)
			return;

		for (const auto id : {PropertyId::Decorator, PropertyId::MaskImage})
		{
			const Property* property = element->GetLocalProperty(id);
			if (!property || property->unit != Unit::DECORATOR)
				continue;

			DecoratorsPtr decorators_ptr = property->Get<DecoratorsPtr>();
			if (!decorators_ptr)
				continue;

			PropertySource document_source("", 0, "");
			const PropertySource* source = property->source.get();

			if (!source)
			{
				if (ElementDocument* document = element->GetOwnerDocument())
				{
					document_source.path = document->GetSourceURL();
					source = &document_source;
				}
			}

			const DecoratorPtrList& decorator_list = style_sheet->InstanceDecorators(*render_manager, *decorators_ptr, source);
			RMLUI_ASSERT(decorator_list.empty() || decorator_list.size() == decorators_ptr->list.size());

			DecoratorEntryList& decorators_target = (id == PropertyId::Decorator ? decorators : mask_images);
			decorators_target.reserve(decorators_ptr->list.size());

			for (size_t i = 0; i < decorator_list.size() && i < decorators_ptr->list.size(); i++)
			{
				const SharedPtr<const Decorator>& decorator = decorator_list[i];
				if (decorator)
				{
					DecoratorEntry entry;
					entry.decorator_data = 0;
					entry.decorator = decorator;
					entry.paint_area = decorators_ptr->list[i].paint_area;
					if (entry.paint_area == BoxArea::Auto)
						entry.paint_area = (id == PropertyId::Decorator ? BoxArea::Padding : BoxArea::Border);

					RMLUI_ASSERT(entry.paint_area >= BoxArea::Border && entry.paint_area <= BoxArea::Content);
					decorators_target.push_back(std::move(entry));
				}
			}
		}
	}

	if (computed.has_filter() || computed.has_backdrop_filter())
	{
		for (const auto id : {PropertyId::Filter, PropertyId::BackdropFilter})
		{
			const Property* property = element->GetLocalProperty(id);
			if (!property || property->unit != Unit::FILTER)
				continue;

			FiltersPtr filters_ptr = property->Get<FiltersPtr>();
			if (!filters_ptr)
				continue;

			FilterEntryList& list = (id == PropertyId::Filter ? filters : backdrop_filters);
			list.reserve(filters_ptr->list.size());

			for (const FilterDeclaration& declaration : filters_ptr->list)
			{
				SharedPtr<const Filter> filter = declaration.instancer->InstanceFilter(declaration.type, declaration.properties);
				if (filter)
				{
					list.push_back({std::move(filter), CompiledFilter{}});
				}
				else
				{
					const auto& source = property->source;
					Log::Message(Log::LT_WARNING, "Filter '%s' in '%s' could not be instanced, declared at %s:%d", declaration.type.c_str(),
						filters_ptr->value.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
				}
			}
		}
	}
}